

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O1

void __thiscall JPG::~JPG(JPG *this)

{
  pointer puVar1;
  pointer pSVar2;
  
  if (this->data != (MCU *)0x0) {
    operator_delete__(this->data);
    this->data = (MCU *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Delete JPG::Data",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  if (this->blocks != (Block *)0x0) {
    operator_delete__(this->blocks);
    this->blocks = (Block *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Delete JPG:blocks",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  if (this->BMPData != (YCbCr *)0x0) {
    operator_delete__(this->BMPData);
    this->BMPData = (YCbCr *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Delete JPG:BMPData",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  puVar1 = (this->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->huffmanData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pSVar2 = (this->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)(this->chromaAC).sortedSymbol.
                                 super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pSVar2);
  }
  pSVar2 = (this->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)(this->chromaDC).sortedSymbol.
                                 super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pSVar2);
  }
  pSVar2 = (this->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)(this->yAC).sortedSymbol.
                                 super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pSVar2);
  }
  pSVar2 = (this->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)(this->yDC).sortedSymbol.
                                 super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pSVar2);
    return;
  }
  return;
}

Assistant:

~JPG() {
        if(data) {
            delete[] data;
            data = nullptr;
            std::cout << "Delete JPG::Data" << std::endl;
        }
        if(blocks) {
            delete[] blocks;
            blocks = nullptr;
            std::cout << "Delete JPG:blocks" << std::endl;
        }
        if(BMPData) {
            delete[] BMPData;
            BMPData = nullptr;
            std::cout << "Delete JPG:BMPData" << std::endl;
        }
    }